

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O1

void d68020_cpbcc_16(m68k_info *info)

{
  uint *puVar1;
  byte bVar2;
  MCInst *inst;
  uint uVar3;
  ulong uVar4;
  
  if ((info->type & 0x1c) != 0) {
    inst = info->inst;
    puVar1 = &inst->Opcode;
    *puVar1 = *puVar1 + (info->ir & 0x2f);
    MCInst_setOpcode(inst,0x5f);
    (info->extension).op_count = '\x01';
    (info->extension).op_size.type = M68K_SIZE_TYPE_CPU;
    (info->extension).op_size.field_1 = (anon_union_4_2_f1e43d3e_for_m68k_op_size_1)0x2;
    uVar4 = (ulong)(info->pc - (int)info->baseAddress & info->address_mask);
    uVar3 = 0xaaaa;
    if (uVar4 + 2 <= info->code_len) {
      uVar3 = (uint)(ushort)(*(ushort *)(info->code + uVar4) << 8 |
                            *(ushort *)(info->code + uVar4) >> 8);
    }
    info->pc = info->pc + 2;
    (info->extension).operands[0].type = M68K_OP_BR_DISP;
    (info->extension).operands[0].address_mode = M68K_AM_BRANCH_DISPLACEMENT;
    (info->extension).operands[0].br_disp.disp = (int)(short)uVar3 & 0xffff0000U | uVar3;
    (info->extension).operands[0].br_disp.disp_size = '\x02';
    bVar2 = info->groups_count;
    info->groups_count = bVar2 + 1;
    info->groups[bVar2] = '\x01';
    bVar2 = info->groups_count;
    info->groups_count = bVar2 + 1;
    info->groups[bVar2] = '\a';
    return;
  }
  build_imm(info,0,info->ir);
  return;
}

Assistant:

static void d68020_cpbcc_16(m68k_info *info)
{
	cs_m68k_op* op0;
	cs_m68k* ext;
	LIMIT_CPU_TYPES(info, M68020_PLUS);

	// these are all in row with the extension so just doing a add here is fine
	info->inst->Opcode += (info->ir & 0x2f);

	ext = build_init_op(info, M68K_INS_FBF, 1, 2);
	op0 = &ext->operands[0];

	make_cpbcc_operand(op0, M68K_OP_BR_DISP_SIZE_WORD, make_int_16(read_imm_16(info)));
	
	set_insn_group(info, M68K_GRP_JUMP);
	set_insn_group(info, M68K_GRP_BRANCH_RELATIVE);
}